

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

bool __thiscall clipp::parser::operator()(parser *this,arg_string *arg)

{
  bool bVar1;
  pattern *ppVar2;
  arg_string *arg_local;
  parser *this_local;
  
  this->eaten_ = this->eaten_ + 1;
  this->index_ = this->index_ + 1;
  bVar1 = valid(this);
  if (bVar1) {
    if (((this->blocked_ & 1U) == 0) && (bVar1 = try_match(this,arg), bVar1)) {
      this_local._7_1_ = true;
    }
    else {
      bVar1 = try_match_blocked(this,arg);
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        if (((this->blocked_ & 1U) == 0) &&
           (bVar1 = detail::scoped_dfs_traverser::matched(&this->pos_), !bVar1)) {
          ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
          bVar1 = group::child_t<clipp::parameter,_clipp::group>::required(ppVar2);
          if (bVar1) {
            ppVar2 = detail::scoped_dfs_traverser::operator->(&this->pos_);
            bVar1 = group::child_t<clipp::parameter,_clipp::group>::blocking(ppVar2);
            if (bVar1) {
              this->blocked_ = true;
            }
          }
        }
        add_nomatch(this,arg);
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator() (const arg_string& arg)
    {
        ++eaten_;
        ++index_;

        if(!valid()) return false;

        if(!blocked_ && try_match(arg)) return true;

        if(try_match_blocked(arg)) return false;

        //skipping of blocking & required patterns is not allowed
        if(!blocked_ && !pos_.matched() && pos_->required() && pos_->blocking()) {
            blocked_ = true;
        }

        add_nomatch(arg);
        return false;
    }